

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVariableReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::EnvironmentVariableReporter::report
          (EnvironmentVariableReporter *this,string *received,string *approved)

{
  bool bVar1;
  char *name;
  string envVar;
  string envVarName;
  string local_60;
  SystemUtils *local_40 [4];
  
  environmentVariableName_abi_cxx11_();
  SystemUtils::safeGetEnv_abi_cxx11_(&local_60,local_40[0],name);
  bVar1 = report(this,&local_60,received,approved);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool EnvironmentVariableReporter::report(std::string received,
                                             std::string approved) const
    {
        // Get the env var
        const auto envVarName = environmentVariableName();
        const auto envVar = SystemUtils::safeGetEnv(envVarName.c_str());
        return report(envVar, received, approved);
    }